

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_iterator.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  List<Employee_*> *pLVar2;
  int local_5c;
  undefined1 local_58 [4];
  int count;
  ListIterator<Employee_*> i;
  Employee *local_38;
  Employee *local_30 [3];
  List<Employee_*> *local_18;
  List<Employee_*> *employees;
  
  employees._4_4_ = 0;
  pLVar2 = (List<Employee_*> *)operator_new(0x18);
  List<Employee_*>::List(pLVar2,200);
  local_18 = pLVar2;
  local_30[0] = (Employee *)operator_new(1);
  List<Employee_*>::Append(pLVar2,local_30);
  pLVar2 = local_18;
  local_38 = (Employee *)operator_new(1);
  List<Employee_*>::Append(pLVar2,&local_38);
  pLVar2 = local_18;
  i._current = (long)operator_new(1);
  List<Employee_*>::Append(pLVar2,(Employee **)&i._current);
  ListIterator<Employee_*>::ListIterator((ListIterator<Employee_*> *)local_58,local_18);
  local_5c = 0;
  ListIterator<Employee_*>::First((ListIterator<Employee_*> *)local_58);
  while( true ) {
    bVar1 = ListIterator<Employee_*>::IsDone((ListIterator<Employee_*> *)local_58);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return employees._4_4_;
    }
    local_5c = local_5c + 1;
    ListIterator<Employee_*>::CurrentItem((ListIterator<Employee_*> *)local_58);
    Employee::Print();
    if (9 < local_5c) break;
    ListIterator<Employee_*>::Next((ListIterator<Employee_*> *)local_58);
  }
  return employees._4_4_;
}

Assistant:

int main()
{
    List<Employee*>* employees;

    employees = new List<Employee*>;
    employees->Append(new Employee);
    employees->Append(new Employee);
    employees->Append(new Employee);


    ListIterator<Employee*> i(employees);
    int count = 0;
    
    for (i.First(); !i.IsDone(); i.Next()) {
        count++;
        i.CurrentItem()->Print();
    
        if (count >= 10) {
            break;
        }
    }

}